

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

bool CLIntercept::Create(void *pGlobalData,CLIntercept **pIntercept)

{
  int iVar1;
  CLIntercept *pCVar2;
  
  pCVar2 = (CLIntercept *)operator_new(0x9f58);
  CLIntercept(pCVar2,pGlobalData);
  *pIntercept = pCVar2;
  iVar1 = init(pCVar2,(EVP_PKEY_CTX *)pGlobalData);
  if (SUB41(iVar1,0) == false) {
    pCVar2 = *pIntercept;
    if (pCVar2 != (CLIntercept *)0x0) {
      ~CLIntercept(pCVar2);
    }
    operator_delete(pCVar2);
    *pIntercept = (CLIntercept *)0x0;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool CLIntercept::Create( void* pGlobalData, CLIntercept*& pIntercept )
{
    bool    success = false;

    pIntercept = new CLIntercept( pGlobalData );
    if( pIntercept )
    {
        success = pIntercept->init();
        if( success == false )
        {
            Delete( pIntercept );
        }
    }

    return success;
}